

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O3

bool Shell::Property::hasXEqualsY(Clause *c)

{
  Literal *pLVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = *(uint *)&c->field_0x38 & 0xfffff;
  if (uVar4 != 0) {
    uVar5 = (ulong)(uVar4 - 1);
    do {
      pLVar1 = c->_literals[uVar5];
      if ((((pLVar1->super_Term)._args[0]._content & 4) != 0) &&
         ((pLVar1->super_Term)._functor == 0)) {
        uVar6 = (ulong)(*(uint *)&(pLVar1->super_Term).field_0xc & 0xfffffff);
        uVar2 = (pLVar1->super_Term)._args[uVar6]._content;
        if (((uVar2 & 1) != 0) &&
           ((uVar6 = (pLVar1->super_Term)._args[uVar6 - 1]._content, (uVar6 & 1) != 0 &&
            ((int)(uVar2 >> 2) != (int)(uVar6 >> 2))))) {
          return true;
        }
      }
      bVar3 = 0 < (long)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
  }
  return false;
}

Assistant:

bool Property::hasXEqualsY(const Clause* c)
{
  for (int i = c->length()-1; i >= 0; i--) {
    const Literal* lit = (*c)[i];
    if (lit->isNegative()) {
      continue;
    }
    if (!lit->isEquality()) {
      continue;
    }
    const TermList* ts1 = lit->args();
    if (!ts1->isVar()) {
      continue;
    }
    const TermList* ts2 = ts1->next();
    if (ts2->isVar() &&
	ts1->var() != ts2->var()) {
      return true;
    }
  }
  return  false;
}